

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

bool __thiscall
QDockAreaLayout::restoreState
          (QDockAreaLayout *this,QDataStream *stream,QList<QDockWidget_*> *_dockwidgets,bool testing
          )

{
  bool bVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  int pos;
  int cnt;
  QSize local_70;
  int local_64;
  QList<QDockWidget_*> local_60;
  QSize local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.d.d = (_dockwidgets->d).d;
  local_60.d.ptr = (_dockwidgets->d).ptr;
  local_60.d.size = (_dockwidgets->d).size;
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_60.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_60.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_64 = -0x55555556;
  QDataStream::operator>>(stream,&local_64);
  if (0 < local_64) {
    iVar3 = 0;
    do {
      local_70.wd.m_i = -0x55555556;
      QDataStream::operator>>(stream,(int *)&local_70);
      local_48.wd.m_i = -1;
      local_48.ht.m_i = -1;
      ::operator>>(stream,&local_48);
      lVar2 = (long)local_70.wd.m_i;
      if (!testing) {
        this->docks[lVar2].rect.x1 = 0;
        this->docks[lVar2].rect.y1 = 0;
        this->docks[lVar2].rect.x2 = (Representation)(local_48.wd.m_i.m_i + -1);
        this->docks[lVar2].rect.y2 = (Representation)(local_48.ht.m_i.m_i + -1);
      }
      bVar1 = QDockAreaLayoutInfo::restoreState(this->docks + lVar2,stream,&local_60,testing);
      if (!bVar1) {
        QDataStream::setStatus((Status)stream);
        bVar1 = false;
        goto LAB_003f550f;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < local_64);
  }
  local_70.wd.m_i = -1;
  local_70.ht.m_i = -1;
  ::operator>>(stream,&local_70);
  (this->centralWidgetRect).x1 = 0;
  (this->centralWidgetRect).y1 = 0;
  (this->centralWidgetRect).x2 = (Representation)(local_70.wd.m_i.m_i + -1);
  (this->centralWidgetRect).y2 = (Representation)(local_70.ht.m_i.m_i + -1);
  bVar1 = stream[0x13] == (QDataStream)0x0;
  if (bVar1) {
    local_48 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    lVar2 = 0;
    do {
      QDataStream::operator>>(stream,(int *)((long)&local_48.wd.m_i + lVar2));
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x10);
    if (stream[0x13] == (QDataStream)0x0) {
      this->corners[0] = local_48.wd.m_i;
      this->corners[1] = local_48.ht.m_i;
      *(undefined1 **)(this->corners + 2) = puStack_40;
    }
    if (!testing) {
      this->fallbackToSizeHints = false;
    }
  }
LAB_003f550f:
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayout::restoreState(QDataStream &stream, const QList<QDockWidget*> &_dockwidgets, bool testing)
{
    QList<QDockWidget*> dockwidgets = _dockwidgets;

    int cnt;
    stream >> cnt;
    for (int i = 0; i < cnt; ++i) {
        int pos;
        stream >> pos;
        QSize size;
        stream >> size;
        if (!testing) {
            docks[pos].rect = QRect(QPoint(0, 0), size);
        }
        if (!docks[pos].restoreState(stream, dockwidgets, testing)) {
            stream.setStatus(QDataStream::ReadCorruptData);
            return false;
        }
    }

    QSize size;
    stream >> size;
    centralWidgetRect = QRect(QPoint(0, 0), size);

    bool ok = stream.status() == QDataStream::Ok;

    if (ok) {
        int cornerData[4];
        for (int i = 0; i < 4; ++i)
            stream >> cornerData[i];
        if (stream.status() == QDataStream::Ok) {
            for (int i = 0; i < 4; ++i)
                corners[i] = static_cast<Qt::DockWidgetArea>(cornerData[i]);
        }

        if (!testing)
            fallbackToSizeHints = false;
    }

    return ok;
}